

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

Expression * soul::operator+(Expression *__return_storage_ptr__,Expression *a,Expression *b)

{
  pointer pSVar1;
  Section *s;
  pointer __args;
  
  std::
  vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ::reserve(&a->sections,
            ((long)(b->sections).
                   super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(b->sections).
                   super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 +
            ((long)(a->sections).
                   super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(a->sections).
                   super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  pSVar1 = (b->sections).
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (b->sections).
                super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != pSVar1; __args = __args + 1) {
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::emplace_back<soul::SourceCodeModel::Expression::Section>(&a->sections,__args);
  }
  (__return_storage_ptr__->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (a->sections).
       super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (a->sections).
       super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (a->sections).
       super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->sections).
  super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression operator+ (SourceCodeModel::Expression a, SourceCodeModel::Expression&& b)
{
    a.sections.reserve (a.sections.size() + b.sections.size());

    for (auto& s : b.sections)
        a.sections.push_back (std::move (s));

    return a;
}